

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdAddTransactionInput
              (void *handle,void *create_handle,char *txid,uint32_t vout,uint32_t sequence)

{
  pointer pcVar1;
  ConfidentialTransaction *this;
  bool bVar2;
  CfdException *pCVar3;
  TransactionContext *tx;
  bool is_bitcoin;
  allocator local_72;
  bool local_71;
  undefined1 local_70 [32];
  string local_50;
  
  cfd::Initialize();
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (!bVar2) {
    local_71 = false;
    cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&local_71);
    this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
    if (this != (ConfidentialTransaction *)0x0) {
      if (local_71 == true) {
        std::__cxx11::string::string((string *)&local_50,txid,&local_72);
        cfd::core::Txid::Txid((Txid *)local_70,&local_50);
        cfd::core::Transaction::AddTxIn
                  ((Transaction *)this,(Txid *)local_70,vout,sequence,
                   (Script *)cfd::core::Script::Empty);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,txid,&local_72);
        cfd::core::Txid::Txid((Txid *)local_70,&local_50);
        cfd::core::ConfidentialTransaction::AddTxIn
                  (this,(Txid *)local_70,vout,sequence,(Script *)cfd::core::Script::Empty);
      }
      local_70._0_8_ = &PTR__Txid_00735400;
      if ((void *)CONCAT44(local_70._12_4_,local_70._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_70._12_4_,local_70._8_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return 0;
    }
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_70);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcapi_transaction.cpp";
  local_70._8_4_ = 0x12f;
  local_70._16_8_ = "CfdAddTransactionInput";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTransactionInput(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    uint32_t sequence) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddTxIn(Txid(std::string(txid)), vout, sequence);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddTxIn(Txid(std::string(txid)), vout, sequence);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}